

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2pointutil.cc
# Opt level: O3

S2Point * S2::Ortho(S2Point *__return_storage_ptr__,S2Point *a)

{
  double *pdVar1;
  int iVar2;
  int b;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double local_38;
  double dStack_30;
  double local_28;
  
  dVar3 = ABS(a->c_[0]);
  dVar4 = ABS(a->c_[1]);
  dVar5 = ABS(a->c_[2]);
  iVar2 = (dVar4 <= dVar5) + 1;
  if (dVar4 < dVar3) {
    iVar2 = (uint)(dVar3 <= dVar5) * 2;
  }
  b = 2;
  if (dVar3 <= dVar5) {
    b = iVar2 + -1;
  }
  if (dVar3 <= dVar4) {
    b = iVar2 + -1;
  }
  local_38 = 0.012;
  dStack_30 = 0.0053;
  local_28 = 0.00457;
  pdVar1 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator[]
                     ((BasicVector<Vector3,_double,_3UL> *)&local_38,b);
  *pdVar1 = 1.0;
  dVar4 = local_28 * a->c_[1] - a->c_[2] * dStack_30;
  dVar5 = local_38 * a->c_[2] - a->c_[0] * local_28;
  dVar3 = dStack_30 * a->c_[0] - a->c_[1] * local_38;
  dVar6 = SQRT(dVar3 * dVar3 + dVar5 * dVar5 + dVar4 * dVar4);
  dVar6 = (double)(~-(ulong)(dVar6 != 0.0) & (ulong)dVar6 |
                  (ulong)(1.0 / dVar6) & -(ulong)(dVar6 != 0.0));
  __return_storage_ptr__->c_[0] = dVar6 * dVar4;
  __return_storage_ptr__->c_[1] = dVar6 * dVar5;
  __return_storage_ptr__->c_[2] = dVar6 * dVar3;
  return __return_storage_ptr__;
}

Assistant:

S2Point Ortho(const S2Point& a) {
#ifdef S2_TEST_DEGENERACIES
  // Vector3::Ortho() always returns a point on the X-Y, Y-Z, or X-Z planes.
  // This leads to many more degenerate cases in polygon operations.
  return a.Ortho();
#else
  int k = a.LargestAbsComponent() - 1;
  if (k < 0) k = 2;
  S2Point temp(0.012, 0.0053, 0.00457);
  temp[k] = 1;
  return a.CrossProd(temp).Normalize();
#endif
}